

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O0

Frag __thiscall re2::Compiler::Cat(Compiler *this,Frag a,Frag b)

{
  bool bVar1;
  InstOp IVar2;
  int iVar3;
  Frag FVar4;
  Inst *this_00;
  Frag in_RDX;
  Frag in_RSI;
  Compiler *in_RDI;
  Inst *begin;
  undefined4 in_stack_ffffffffffffffb0;
  uint32_t in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  PatchList in_stack_ffffffffffffffc4;
  uint32_t local_18;
  PatchList PStack_14;
  uint32_t local_10;
  PatchList PStack_c;
  Frag local_8;
  
  bVar1 = IsNoMatch(in_RSI);
  if ((bVar1) || (bVar1 = IsNoMatch(in_RDX), bVar1)) {
    FVar4 = NoMatch(in_RDI);
    return FVar4;
  }
  this_00 = PODArray<re2::Prog::Inst>::operator[]
                      ((PODArray<re2::Prog::Inst> *)
                       CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       (int)((ulong)in_RDI >> 0x20));
  IVar2 = Prog::Inst::opcode(this_00);
  local_10 = in_RSI.begin;
  PStack_c = in_RSI.end.p;
  if ((IVar2 == kInstNop) &&
     ((PStack_c.p == local_10 * 2 && (iVar3 = Prog::Inst::out(this_00), iVar3 == 0)))) {
    PODArray<re2::Prog::Inst>::data((PODArray<re2::Prog::Inst> *)0x235be0);
    PatchList::Patch((Inst *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),PStack_c,
                     in_stack_ffffffffffffffb4);
    return in_RDX;
  }
  PStack_14 = in_RDX.end.p;
  if ((in_RDI->reversed_ & 1U) != 0) {
    PODArray<re2::Prog::Inst>::data((PODArray<re2::Prog::Inst> *)0x235c1e);
    PatchList::Patch((Inst *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                     in_stack_ffffffffffffffc4,in_stack_ffffffffffffffb4);
    local_18 = in_RDX.begin;
    Frag::Frag(&local_8,local_18,PStack_c);
    return local_8;
  }
  PODArray<re2::Prog::Inst>::data((PODArray<re2::Prog::Inst> *)0x235c5f);
  PatchList::Patch((Inst *)CONCAT44(in_stack_ffffffffffffffbc,PStack_c.p),in_stack_ffffffffffffffc4,
                   in_stack_ffffffffffffffb4);
  Frag::Frag(&local_8,local_10,PStack_14);
  return local_8;
}

Assistant:

Frag Compiler::Cat(Frag a, Frag b) {
  if (IsNoMatch(a) || IsNoMatch(b))
    return NoMatch();

  // Elide no-op.
  Prog::Inst* begin = &inst_[a.begin];
  if (begin->opcode() == kInstNop &&
      a.end.p == (a.begin << 1) &&
      begin->out() == 0) {
    // in case refs to a somewhere
    PatchList::Patch(inst_.data(), a.end, b.begin);
    return b;
  }

  // To run backward over string, reverse all concatenations.
  if (reversed_) {
    PatchList::Patch(inst_.data(), b.end, a.begin);
    return Frag(b.begin, a.end);
  }

  PatchList::Patch(inst_.data(), a.end, b.begin);
  return Frag(a.begin, b.end);
}